

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

void __thiscall QAccessibleTableCell::doAction(QAccessibleTableCell *this,QString *actionName)

{
  bool bVar1;
  char cVar2;
  QString *s2;
  
  s2 = (QString *)QAccessibleActionInterface::toggleAction();
  bVar1 = ::comparesEqual(actionName,s2);
  if (!bVar1) {
    return;
  }
  cVar2 = (**(code **)(*(long *)this + 0xd8))(this);
  if (cVar2 != '\0') {
    unselectCell(this);
    return;
  }
  selectCell(this);
  return;
}

Assistant:

void QAccessibleTableCell::doAction(const QString& actionName)
{
    if (actionName == toggleAction()) {
#if defined(Q_OS_ANDROID)
        QAccessibleInterface *parentInterface = parent();
        while (parentInterface){
            if (parentInterface->role() == QAccessible::ComboBox) {
                selectCell();
                parentInterface->actionInterface()->doAction(pressAction());
                return;
            } else {
                parentInterface = parentInterface->parent();
            }
        }
#endif
        if (isSelected()) {
            unselectCell();
        } else {
            selectCell();
        }
    }
}